

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O1

void UnitTest::CheckEqual<char[25],std::__cxx11::string>
               (TestResults *results,char (*expected) [25],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual,
               TestDetails *details)

{
  int iVar1;
  size_t sVar2;
  char *failure;
  MemoryOutStream stream;
  undefined1 local_1c0 [408];
  
  iVar1 = std::__cxx11::string::compare((char *)actual);
  if (iVar1 != 0) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Expected ",9);
    sVar2 = strlen(*expected);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,*expected,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0," but was ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,(actual->_M_dataplus)._M_p,actual->_M_string_length);
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c0,&MemoryOutStream::VTT);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x90));
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}